

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_capacity_valid_fn(int _i)

{
  char *pcVar1;
  size_t sVar2;
  int line;
  char *pcVar3;
  undefined8 uVar4;
  AString string;
  
  string.size = 0;
  string.reallocator = (ACUtilsReallocator)0x0;
  string.deallocator = (ACUtilsDeallocator)0x0;
  string.buffer = (char *)0x0;
  string.capacity = 0x2a;
  sVar2 = AString_capacity(&string);
  if (sVar2 == 0x2a) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x11b);
    string.capacity = 0xd;
    sVar2 = AString_capacity(&string);
    if (sVar2 == 0xd) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x11d);
      string.capacity = 0;
      sVar2 = AString_capacity(&string);
      if (sVar2 == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x11f);
        return;
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x11f,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                        "AString_capacity(&string) == 0","AString_capacity(&string)",sVar2,"0",0,0);
    }
    pcVar1 = "(void*) AString_buffer(&string) == (void*) (char*) 13";
    pcVar3 = "AString_capacity(&string) == 13";
    line = 0x11d;
    uVar4 = 0xd;
  }
  else {
    pcVar1 = "(void*) AString_buffer(&string) == (void*) (char*) 42";
    pcVar3 = "AString_capacity(&string) == 42";
    line = 0x11b;
    uVar4 = 0x2a;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,line,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar3,
                    "AString_capacity(&string)",sVar2,pcVar1 + 0x33,uVar4,0);
}

Assistant:

START_TEST(test_AString_capacity_valid)
{
    struct AString string = {nullptr, nullptr};
    string.capacity = 42;
    ACUTILSTEST_ASSERT_UINT_EQ(AString_capacity(&string), 42);
    string.capacity = 13;
    ACUTILSTEST_ASSERT_UINT_EQ(AString_capacity(&string), 13);
    string.capacity = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(AString_capacity(&string), 0);
}